

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::unmap_range<long>(Omega_h *this,LO begin,LO end,Read<signed_char> *b_data,Int width)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  allocator local_79;
  Write<signed_char> a_data;
  Write<int> local_68;
  type f;
  
  if (begin <= end) {
    std::__cxx11::string::string((string *)&f,"",&local_79);
    Write<long>::Write((Write<long> *)&a_data,(end - begin) * width,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    f.begin = begin;
    f.width = width;
    Write<long>::Write((Write<int> *)&f.a_data,(Write<int> *)&a_data);
    Write<long>::Write((Write<int> *)&f.b_data,(Write<int> *)b_data);
    parallel_for<Omega_h::unmap_range<long>(int,int,Omega_h::Read<long>,int)::_lambda(int)_1_>
              (end - begin,&f,"unmap_range");
    Write<long>::Write(&local_68,(Write<int> *)&a_data);
    Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_68);
    Write<long>::~Write((Write<long> *)&local_68);
    unmap_range<long>(int,int,Omega_h::Read<long>,int)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&f);
    Write<long>::~Write((Write<long> *)&a_data);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","begin <= end",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x5b);
}

Assistant:

Read<T> unmap_range(LO begin, LO end, Read<T> b_data, Int width) {
  OMEGA_H_CHECK(begin <= end);
  auto na = end - begin;
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a + begin;
    for (Int j = 0; j < width; ++j) {
      a_data[a * width + j] = b_data[b * width + j];
    }
  };
  parallel_for(na, f, "unmap_range");
  return a_data;
}